

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O0

void container_suite::test_object_bool_two(void)

{
  string local_268 [36];
  undefined4 local_244;
  size_type local_240;
  undefined4 local_234;
  size_type local_230;
  undefined4 local_224;
  size_type local_220;
  undefined4 local_214;
  size_type local_210;
  undefined4 local_204;
  size_type local_200;
  undefined4 local_1f4;
  size_type local_1f0;
  undefined4 local_1e4;
  size_type local_1e0;
  undefined4 local_1d4;
  size_type local_1d0;
  undefined4 local_1c4;
  size_type local_1c0 [3];
  undefined1 local_1a8 [8];
  encoder_type encoder;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::detail::basic_encoder<char,24ul>::
  basic_encoder<std::__cxx11::ostringstream>
            ((basic_encoder<char,24ul> *)local_1a8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_1c0[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::
                 value<trial::protocol::json::token::begin_object>
                           ((basic_encoder<char,_24UL> *)local_1a8);
  local_1c4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::begin_object>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3bd,"void container_suite::test_object_bool_two()",local_1c0,&local_1c4);
  local_1d0 = trial::protocol::json::detail::basic_encoder<char,_24UL>::value
                        ((basic_encoder<char,_24UL> *)local_1a8,"false");
  local_1d4 = 7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(\"false\")","7",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3be,"void container_suite::test_object_bool_two()",&local_1d0,&local_1d4);
  local_1e0 = trial::protocol::json::detail::basic_encoder<char,_24UL>::
              value<trial::protocol::json::token::detail::name_separator>
                        ((basic_encoder<char,_24UL> *)local_1a8);
  local_1e4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::detail::name_separator>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3bf,"void container_suite::test_object_bool_two()",&local_1e0,&local_1e4);
  local_1f0 = trial::protocol::json::detail::basic_encoder<char,_24UL>::value
                        ((basic_encoder<char,_24UL> *)local_1a8,false);
  local_1f4 = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(false)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c0,"void container_suite::test_object_bool_two()",&local_1f0,&local_1f4);
  local_200 = trial::protocol::json::detail::basic_encoder<char,_24UL>::
              value<trial::protocol::json::token::detail::value_separator>
                        ((basic_encoder<char,_24UL> *)local_1a8);
  local_204 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::detail::value_separator>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c1,"void container_suite::test_object_bool_two()",&local_200,&local_204);
  local_210 = trial::protocol::json::detail::basic_encoder<char,_24UL>::value
                        ((basic_encoder<char,_24UL> *)local_1a8,"true");
  local_214 = 6;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(\"true\")","6",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c2,"void container_suite::test_object_bool_two()",&local_210,&local_214);
  local_220 = trial::protocol::json::detail::basic_encoder<char,_24UL>::
              value<trial::protocol::json::token::detail::name_separator>
                        ((basic_encoder<char,_24UL> *)local_1a8);
  local_224 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::detail::name_separator>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c3,"void container_suite::test_object_bool_two()",&local_220,&local_224);
  local_230 = trial::protocol::json::detail::basic_encoder<char,_24UL>::value
                        ((basic_encoder<char,_24UL> *)local_1a8,true);
  local_234 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(true)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c4,"void container_suite::test_object_bool_two()",&local_230,&local_234);
  local_240 = trial::protocol::json::detail::basic_encoder<char,_24UL>::
              value<trial::protocol::json::token::end_object>
                        ((basic_encoder<char,_24UL> *)local_1a8);
  local_244 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::end_object>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c5,"void container_suite::test_object_bool_two()",&local_240,&local_244);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[28]>
            ("result.str()","\"{\\\"false\\\":false,\\\"true\\\":true}\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c6,"void container_suite::test_object_bool_two()",local_268,
             "{\"false\":false,\"true\":true}");
  std::__cxx11::string::~string(local_268);
  trial::protocol::json::detail::basic_encoder<char,_24UL>::~basic_encoder
            ((basic_encoder<char,_24UL> *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_object_bool_two()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::begin_object>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value("false"), 7);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::detail::name_separator>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(false), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::detail::value_separator>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value("true"), 6);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::detail::name_separator>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(true), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::end_object>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "{\"false\":false,\"true\":true}");
}